

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O2

void __thiscall
QNetworkReplyHttpImplPrivate::~QNetworkReplyHttpImplPrivate(QNetworkReplyHttpImplPrivate *this)

{
  ~QNetworkReplyHttpImplPrivate(this);
  operator_delete(this,0x448);
  return;
}

Assistant:

QNetworkReplyHttpImplPrivate::~QNetworkReplyHttpImplPrivate()
{
}